

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleic_acid_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupNucleicAcidTest_Inflate_Test::~BiosoupNucleicAcidTest_Inflate_Test
          (BiosoupNucleicAcidTest_Inflate_Test *this)

{
  BiosoupNucleicAcidTest_Inflate_Test *this_local;
  
  ~BiosoupNucleicAcidTest_Inflate_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupNucleicAcidTest, Inflate) {
  NucleicAcid s{"test", "AaAaCcCcGgGgTtTt------ACGTRYKMSWBDHVN-nvhdbwsmkyrtgca------tTtTgGgGcCcCaAaA"};  // NOLINT
  EXPECT_EQ(s.deflated_data.size(), s.deflated_data.capacity());
  EXPECT_EQ(0, s.Code(16));
  EXPECT_EQ(1, s.Code(23));
  EXPECT_EQ(2, s.Code(35));
  EXPECT_EQ(3, s.Code(59));
  EXPECT_EQ("AAAACCCCGGGGTTTTAAAAAAACGTATGCCACATGAAAGTACACCGTATGCAAAAAAATTTTGGGGCCCCAAAA", s.InflateData());  // NOLINT
  EXPECT_EQ("TATGCCACATGAAAGTACACCGTAT", s.InflateData(25, 25));
  EXPECT_EQ("TGAAAGT", s.InflateData(34, 7));
  EXPECT_EQ("", s.InflateData(75, 42));
  EXPECT_EQ("C", s.InflateData(29, 1));
  EXPECT_EQ("G", s.InflateData(64, 1));
  EXPECT_EQ("CCAAAA", s.InflateData(69));
}